

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::FilePathBasename_abi_cxx11_(FileDescriptor *file)

{
  FileDescriptor *in_RSI;
  string *in_RDI;
  bool in_stack_00000017;
  string *in_stack_00000018;
  string directory;
  string basename;
  string *output;
  string local_a8 [24];
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  string local_58 [32];
  string local_38 [39];
  byte local_11;
  FileDescriptor *local_10;
  string *filename;
  
  local_11 = 0;
  local_10 = in_RSI;
  filename = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  FileDescriptor::name_abi_cxx11_(local_10);
  anon_unknown_0::PathSplit
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  StripProto(filename);
  std::__cxx11::string::operator=(local_38,(string *)&stack0xffffffffffffff78);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  anon_unknown_0::UnderscoresToCamelCase(in_stack_00000018,in_stack_00000017);
  std::__cxx11::string::operator=((string *)in_RDI,local_a8);
  std::__cxx11::string::~string(local_a8);
  local_11 = 1;
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  if ((local_11 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

string FilePathBasename(const FileDescriptor* file) {
  string output;
  string basename;
  string directory;
  PathSplit(file->name(), &directory, &basename);
  basename = StripProto(basename);

  // CamelCase to be more ObjC friendly.
  output = UnderscoresToCamelCase(basename, true);

  return output;
}